

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRequest.cpp
# Opt level: O1

void xmrig::JsonRequest::create(Document *doc,int64_t id,char *method,Value *params)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  size_t sVar1;
  Data local_88;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_88.s.str = (Ch *)0x40500000018a1a3;
  local_88.n = (Number)0x2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<long>(&doc->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_88.s,id,allocator);
  local_40.s = "jsonrpc";
  local_40.length = 7;
  local_50.s = "2.0";
  local_50.length = 3;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_40,&local_50,allocator);
  local_60.s = "method";
  local_60.length = 6;
  local_70.s = method;
  sVar1 = strlen(method);
  local_70.length = (SizeType)sVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,&local_60,&local_70,allocator);
  local_88.s.str = (Ch *)0x40500000018d2f0;
  local_88.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&doc->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_88.s,params,allocator);
  return;
}

Assistant:

void xmrig::JsonRequest::create(rapidjson::Document &doc, int64_t id, const char *method, rapidjson::Value &params)
{
    auto &allocator = doc.GetAllocator();

    doc.AddMember("id",      id, allocator);
    doc.AddMember("jsonrpc", "2.0", allocator);
    doc.AddMember("method",  rapidjson::StringRef(method), allocator);
    doc.AddMember("params",  params, allocator);
}